

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

cf_errno_t cf_que_dequeue(cf_que_t *que,cf_void_t **data,cf_size_t *size)

{
  uint uVar1;
  cf_errno_t cVar2;
  cf_uint_t cVar3;
  
  if (size == (cf_size_t *)0x0 || (data == (cf_void_t **)0x0 || que == (cf_que_t *)0x0)) {
    cVar2 = 2;
  }
  else if (que->empty == 1) {
    cVar2 = 6;
  }
  else {
    uVar1 = que->head;
    *data = que->items[uVar1].data;
    *size = que->items[uVar1].size;
    cVar2 = 0;
    cVar3 = (cf_uint_t)((ulong)(uVar1 + 1) % que->max_size);
    que->head = cVar3;
    if (que->tail == cVar3) {
      que->empty = 1;
    }
  }
  return cVar2;
}

Assistant:

cf_errno_t  cf_que_dequeue(cf_que_t* que, cf_void_t** data, cf_size_t* size) {
    if(!que || !data || size == 0) return CF_EPARAM;
    if(que->empty == CF_TRUE) return CF_EEMPTY;

    *data = que->items[que->head].data;
    *size = que->items[que->head].size;
    que->head = (que->head + 1) % que->max_size;

    if(que->head == que->tail) que->empty = CF_TRUE;
    return CF_OK;
}